

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereRecord2.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::SphereRecord2::Decode(SphereRecord2 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x3f < KVar1) {
    KDataStream::Read<unsigned_int>
              (stream,&(this->super_SphereRecord1).super_BoundingSphereRecord.
                       super_EnvironmentRecord.m_ui32EnvRecTyp);
    KDataStream::Read<unsigned_short>
              (stream,&(this->super_SphereRecord1).super_BoundingSphereRecord.
                       super_EnvironmentRecord.m_ui16Length);
    KDataStream::Read(stream,&(this->super_SphereRecord1).super_BoundingSphereRecord.
                              super_EnvironmentRecord.m_ui8Index);
    KDataStream::Read(stream,&(this->super_SphereRecord1).super_BoundingSphereRecord.
                              super_EnvironmentRecord.m_ui8Padding);
    (*(this->super_SphereRecord1).super_BoundingSphereRecord.m_CentLocation.super_DataTypeBase.
      _vptr_DataTypeBase[3])
              (&(this->super_SphereRecord1).super_BoundingSphereRecord.m_CentLocation,stream);
    KDataStream::Read<float>
              (stream,(float *)&(this->super_SphereRecord1).super_BoundingSphereRecord.m_f32Rad);
    KDataStream::Read<float>(stream,(float *)&this->m_f32ddt);
    (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Velocity,stream);
    (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AngularVelocity,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void SphereRecord2::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < SPHERE_RECORD_2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> KDIS_STREAM m_CentLocation
           >> m_f32Rad
           >> m_f32ddt
           >> KDIS_STREAM m_Velocity
           >> KDIS_STREAM m_AngularVelocity;
}